

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::Message::Message(Message *this)

{
  _Setprecision _Var1;
  stringstream *this_00;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  
  this_00 = (stringstream *)operator_new(0x188);
  std::__cxx11::stringstream::stringstream(this_00);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(in_RDI,(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      this_00);
  pbVar2 = internal::
           scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(in_RDI);
  _Var1 = std::setprecision(0x11);
  std::operator<<((ostream *)(pbVar2 + 0x10),_Var1);
  return;
}

Assistant:

Message::Message() : ss_(new ::std::stringstream) {
  // By default, we want there to be enough precision when printing
  // a double to a Message.
  *ss_ << std::setprecision(std::numeric_limits<double>::digits10 + 2);
}